

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_messageboxbutton.cpp
# Opt level: O0

void QtMWidgets::MsgBoxButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  MsgBoxButton *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      _q_pressed((MsgBoxButton *)_o);
    }
    else if (_id == 1) {
      _q_released((MsgBoxButton *)_o);
    }
  }
  return;
}

Assistant:

void QtMWidgets::MsgBoxButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<MsgBoxButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->_q_pressed(); break;
        case 1: _t->_q_released(); break;
        default: ;
        }
    }
    (void)_a;
}